

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

char * __thiscall libchars::commands::color_str(commands *this,command_colors_e color_idx)

{
  char *pcVar1;
  
  pcVar1 = "";
  if ((color_idx < (COLOR_PARTIAL_ARGUMENT|COLOR_VALID_COMMAND)) &&
     (((this->edit).driver)->control_enabled != false)) {
    pcVar1 = &DAT_00115110 + *(int *)(&DAT_00115110 + (ulong)color_idx * 4);
  }
  return pcVar1;
}

Assistant:

const char *commands::color_str(command_colors_e color_idx) const
    {
        if (!edit.control())
            return "";

        switch (color_idx) {
        case COLOR_NORMAL:           return "\x1b[0m";
        case COLOR_UNKNOWN_TOKEN:    return "\x1b[0;31m";
        case COLOR_VALID_COMMAND:    return "\x1b[0;32m";
        case COLOR_INVALID_COMMAND:  return "\x1b[1;31m";
        case COLOR_PARTIAL_COMMAND:  return "\x1b[0;33m";
        case COLOR_COMPLETION:       return "\x1b[0;36m";
        case COLOR_QUOTED_STRING:    return "\x1b[1;34m";
        case COLOR_VALID_ARGUMENT:   return "\x1b[1m";
        case COLOR_PARTIAL_ARGUMENT: return "\x1b[0m";
        case COLOR_INVALID_ARGUMENT: return "\x1b[1;31m";
        default: return "";
        }
    }